

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O2

int pchars8(PCRE2_SPTR8 p,int length,BOOL utf,FILE *f)

{
  byte bVar1;
  uint in_EAX;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  undefined8 uStack_38;
  uint32_t c;
  
  sVar4 = (size_t)(uint)length;
  uStack_38 = (ulong)in_EAX;
  if (length < 0) {
    sVar4 = strlen((char *)p);
  }
  iVar6 = 0;
  do {
    iVar3 = (int)sVar4;
    if (iVar3 < 1) {
      return iVar6;
    }
    if (utf == 0) {
LAB_0010a7ba:
      uVar5 = iVar3 - 1;
      bVar1 = *p;
      p = p + 1;
      uStack_38 = (ulong)CONCAT14(bVar1,(undefined4)uStack_38);
      uVar2 = (uint)bVar1;
    }
    else {
      uVar2 = utf82ord(p,(uint32_t *)((long)&uStack_38 + 4));
      uVar5 = iVar3 - uVar2;
      if (iVar3 < (int)uVar2 || (int)uVar2 < 1) goto LAB_0010a7ba;
      p = p + uVar2;
      uVar2 = uStack_38._4_4_;
    }
    sVar4 = (size_t)uVar5;
    iVar3 = pchar(uVar2,utf,f);
    iVar6 = iVar6 + iVar3;
  } while( true );
}

Assistant:

static int pchars8(PCRE2_SPTR8 p, int length, BOOL utf, FILE *f)
{
uint32_t c = 0;
int yield = 0;
if (length < 0) length = strlen((char *)p);
while (length-- > 0)
  {
  if (utf)
    {
    int rc = utf82ord(p, &c);
    if (rc > 0 && rc <= length + 1)   /* Mustn't run over the end */
      {
      length -= rc - 1;
      p += rc;
      yield += pchar(c, utf, f);
      continue;
      }
    }
  c = *p++;
  yield += pchar(c, utf, f);
  }
return yield;
}